

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::RecursiveStructMemberIterator::prepNext(RecursiveStructMemberIterator *this)

{
  size_type sVar1;
  pointer pSVar2;
  FieldSymbol **ppFVar3;
  Type *this_00;
  Type *pTVar4;
  ConstantValue *pCVar5;
  size_t sVar6;
  SyntaxNode *pSVar7;
  
  pSVar7 = (SyntaxNode *)(this->curr).fieldIt._M_current;
  do {
    if (pSVar7 == (SyntaxNode *)(this->curr).fieldEnd._M_current) {
      sVar1 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.
              len;
      if (sVar1 == 0) {
        (this->curr).type = (Type *)0x0;
        return;
      }
      pSVar2 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>
               .data_;
      pCVar5 = pSVar2[sVar1 - 1].val;
      pTVar4 = pSVar2[sVar1 - 1].type;
      ppFVar3 = ((FieldIt *)(&pSVar2[sVar1 - 1].valIndex + 1))->_M_current;
      (this->curr).valIndex = pSVar2[sVar1 - 1].valIndex;
      (this->curr).fieldIt._M_current = ppFVar3;
      (this->curr).val = pCVar5;
      (this->curr).type = pTVar4;
      (this->curr).fieldEnd._M_current = pSVar2[sVar1 - 1].fieldEnd._M_current;
      (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len =
           sVar1 - 1;
      sVar6 = (this->curr).valIndex;
      pSVar7 = (SyntaxNode *)((this->curr).fieldIt._M_current + 1);
      (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar7;
      sVar6 = sVar6 + 1;
    }
    else {
      this_00 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar7 + 0x40));
      pTVar4 = this_00->canonical;
      if (pTVar4 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar4 = this_00->canonical;
      }
      if ((pTVar4->super_Symbol).kind != UnpackedStructType) {
        return;
      }
      SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
      emplace_back<slang::ast::RecursiveStructMemberIterator::State&>
                (&(this->stack).
                  super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>,
                 &this->curr);
      pTVar4 = this_00->canonical;
      if (pTVar4 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar4 = this_00->canonical;
      }
      pSVar7 = pTVar4[1].super_Symbol.originatingSyntax;
      pTVar4 = pTVar4[1].canonical;
      (this->curr).type = this_00;
      pCVar5 = ConstantValue::at((this->curr).val,(this->curr).valIndex);
      (this->curr).val = pCVar5;
      (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar7;
      (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar7->kind + (long)pTVar4 * 2);
      sVar6 = 0;
    }
    (this->curr).valIndex = sVar6;
  } while( true );
}

Assistant:

void prepNext() {
        if (curr.fieldIt == curr.fieldEnd) {
            if (stack.empty()) {
                curr.type = nullptr;
                return;
            }

            curr = stack.back();
            stack.pop_back();

            curr.next();
            prepNext();
        }
        else {
            auto& type = (*curr.fieldIt)->getType();
            if (type.isUnpackedStruct()) {
                stack.emplace_back(curr);

                auto fields = type.getCanonicalType().as<UnpackedStructType>().fields;
                curr.type = &type;
                curr.val = &curr.val->at(curr.valIndex);
                curr.fieldIt = fields.begin();
                curr.fieldEnd = fields.end();
                curr.valIndex = 0;
                prepNext();
            }
        }
    }